

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O0

void PrintDebug(Proto *f)

{
  uint uVar1;
  char *local_28;
  uint local_14;
  int n;
  int i;
  Proto *f_local;
  
  uVar1 = f->sizek;
  printf("constants (%d) for %p:\n",(ulong)uVar1,f);
  for (local_14 = 0; (int)local_14 < (int)uVar1; local_14 = local_14 + 1) {
    printf("\t%d\t",(ulong)local_14);
    PrintType(f,local_14);
    PrintConstant(f,local_14);
    printf(anon_var_dwarf_a3c7 + 5);
  }
  uVar1 = f->sizelocvars;
  printf("locals (%d) for %p:\n",(ulong)uVar1,f);
  for (local_14 = 0; (int)local_14 < (int)uVar1; local_14 = local_14 + 1) {
    printf("\t%d\t%s\t%d\t%d\n",(ulong)local_14,(f->locvars[(int)local_14].varname)->contents,
           (ulong)(f->locvars[(int)local_14].startpc + 1),
           (ulong)(f->locvars[(int)local_14].endpc + 1));
  }
  uVar1 = f->sizeupvalues;
  printf("upvalues (%d) for %p:\n",(ulong)uVar1,f);
  for (local_14 = 0; (int)local_14 < (int)uVar1; local_14 = local_14 + 1) {
    if (f->upvalues[(int)local_14].name == (TString *)0x0) {
      local_28 = "-";
    }
    else {
      local_28 = (f->upvalues[(int)local_14].name)->contents;
    }
    printf("\t%d\t%s\t%d\t%d\n",(ulong)local_14,local_28,(ulong)f->upvalues[(int)local_14].instack,
           (ulong)f->upvalues[(int)local_14].idx);
  }
  return;
}

Assistant:

static void PrintDebug(const Proto* f)
{
 int i,n;
 n=f->sizek;
 printf("constants (%d) for %p:\n",n,VOID(f));
 for (i=0; i<n; i++)
 {
  printf("\t%d\t",i);
  PrintType(f,i);
  PrintConstant(f,i);
  printf("\n");
 }
 n=f->sizelocvars;
 printf("locals (%d) for %p:\n",n,VOID(f));
 for (i=0; i<n; i++)
 {
  printf("\t%d\t%s\t%d\t%d\n",
  i,getstr(f->locvars[i].varname),f->locvars[i].startpc+1,f->locvars[i].endpc+1);
 }
 n=f->sizeupvalues;
 printf("upvalues (%d) for %p:\n",n,VOID(f));
 for (i=0; i<n; i++)
 {
  printf("\t%d\t%s\t%d\t%d\n",
  i,UPVALNAME(i),f->upvalues[i].instack,f->upvalues[i].idx);
 }
}